

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

void Abc_NodeInvUpdateObjFanoutPolarity(Abc_Obj_t *pObj,Abc_Obj_t *pFanout)

{
  int i;
  
  if (((*(uint *)&pFanout->field_0x14 & 0xf) == 7) && ((pFanout->vFanins).nSize == 1)) {
    Abc_NodeInvUpdateFanPolarity(pFanout);
    return;
  }
  i = Abc_NodeFindFanin(pFanout,pObj);
  Abc_ObjFaninFlipPhase(pFanout,i);
  return;
}

Assistant:

void Abc_NodeInvUpdateObjFanoutPolarity( Abc_Obj_t * pObj, Abc_Obj_t * pFanout )
{
    if ( Abc_SclObjIsBufInv(pFanout) )
        Abc_NodeInvUpdateFanPolarity( pFanout );
    else
        Abc_ObjFaninFlipPhase( pFanout, Abc_NodeFindFanin(pFanout, pObj) );
}